

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O1

BBox3fa * embree::sse2::evalGridBounds
                    (BBox3fa *__return_storage_ptr__,SubdivPatch1Base *patch,uint x0,uint x1,uint y0
                    ,uint y1,uint swidth,uint sheight,SubdivMesh *geom)

{
  uint uVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar4;
  undefined8 *puVar5;
  size_t sVar6;
  pointer pRVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  code *pcVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined8 uVar23;
  undefined8 uVar24;
  float *pfVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar26;
  uint uVar27;
  uint uVar28;
  size_t i;
  ulong uVar29;
  ulong uVar30;
  float *pfVar31;
  long lVar32;
  void *pvVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *Ny;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  float *pfVar39;
  float *pfVar40;
  long lVar41;
  undefined4 *puVar42;
  float *pfVar43;
  ulong uVar44;
  uint uVar45;
  int iVar46;
  ulong uVar47;
  float *pfVar48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar49;
  uint uVar50;
  float *pfVar51;
  float fVar52;
  float fVar53;
  ulong uVar54;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  float fVar105;
  undefined1 in_XMM6 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  uint x;
  GeneralCatmullClarkPatch3fa ccpatch;
  RTCDisplacementFunctionNArguments args;
  Vec3vfx vtx;
  Vec3vfx normal;
  StackArray<float,_16384UL> grid_v;
  vfloatx v;
  vfloatx u;
  StackArray<float,_16384UL> grid_Ng_z;
  float fStack_22034;
  undefined1 auStack_22010 [16];
  undefined1 auStack_21fc0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_21f00;
  uint uStack_21ef0;
  uint uStack_21eec;
  float *pfStack_21ee8;
  float *pfStack_21ee0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ed8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ed0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paStack_21ec8;
  float *pfStack_21ec0;
  float *pfStack_21eb8;
  float *pfStack_21eb0;
  uint uStack_21ea8;
  undefined4 auStack_21b9c [1575];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_20300;
  undefined4 uStack_202c0;
  undefined8 uStack_20280;
  undefined8 uStack_20278;
  float fStack_20270;
  float fStack_2026c;
  undefined8 uStack_20268;
  undefined8 uStack_20260;
  undefined8 uStack_20258;
  undefined1 *puStack_20250;
  undefined1 (*pauStack_20248) [16];
  undefined1 *puStack_20240;
  undefined1 *puStack_20238;
  undefined1 (*pauStack_20230) [16];
  undefined4 uStack_20228;
  float *pfStack_1c280;
  ulong uStack_1c278;
  undefined1 auStack_1c240 [16];
  undefined1 auStack_1c230 [16];
  undefined1 aauStack_1c220 [1022] [16];
  float *pfStack_18240;
  ulong uStack_18238;
  undefined1 auStack_18200 [16];
  undefined1 auStack_181f0 [16];
  undefined1 aauStack_181e0 [1022] [16];
  float *pfStack_14200;
  ulong uStack_141f8;
  float afStack_141c0 [4096];
  float *pfStack_101c0;
  ulong uStack_101b8;
  float afStack_10180 [4096];
  float *local_c180;
  ulong local_c178;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_c140 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_8140;
  ulong local_8138;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_8100 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_4100;
  ulong local_40f8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_40c0 [1024];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *local_c0;
  ulong local_b8;
  
  auStack_22010._8_8_ = 0x7f8000007f800000;
  auStack_22010._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0x7f8000007f800000;
  auVar64 = _DAT_01feba00;
  *(undefined1 (*) [16])(__return_storage_ptr__->upper).field_0.m128 = _DAT_01feba00;
  uVar34 = x1 - x0;
  uVar35 = uVar34 + 1;
  iVar46 = y1 - y0;
  uVar45 = iVar46 + 1;
  uVar27 = uVar45 * uVar35;
  uVar29 = (ulong)uVar27;
  uVar50 = uVar27 + 4;
  uVar44 = (ulong)uVar50;
  sVar6 = uVar44 * 4;
  uStack_101b8 = uVar44;
  local_c178 = uVar44;
  if (uVar50 < 0x1001) {
    local_c180 = afStack_10180;
    pfStack_101c0 = afStack_141c0;
  }
  else {
    local_c180 = (float *)alignedMalloc(sVar6,0x40);
    pfStack_101c0 = (float *)alignedMalloc(sVar6,0x40);
    auVar64 = _DAT_01feba00;
  }
  uVar36 = uVar27 + 3;
  uVar37 = uVar36 >> 2;
  if (patch->type != '\x05') {
    uVar50 = swidth - 1;
    uVar1 = sheight - 1;
    if (uVar45 != 0) {
      auVar61._0_4_ = (float)(int)uVar50;
      auVar61._4_4_ = (float)(int)uVar50;
      auVar61._8_4_ = (float)(int)uVar50;
      auVar61._12_4_ = (float)(int)uVar50;
      auVar94 = rcpps(in_XMM5,auVar61);
      fVar87 = auVar94._0_4_;
      fVar91 = auVar94._4_4_;
      fVar92 = auVar94._8_4_;
      fVar93 = auVar94._12_4_;
      auVar94._0_4_ = (float)(int)uVar1;
      auVar94._4_4_ = (float)(int)uVar1;
      auVar94._8_4_ = (float)(int)uVar1;
      auVar94._12_4_ = (float)(int)uVar1;
      auVar100 = rcpps(in_XMM6,auVar94);
      fVar53 = auVar100._0_4_;
      fVar104 = auVar100._4_4_;
      fVar105 = auVar100._8_4_;
      fVar52 = auVar100._12_4_;
      iVar106 = 0;
      iVar107 = 0;
      iVar108 = 0;
      iVar109 = 0;
      lVar41 = 0;
      iVar38 = 0;
      do {
        if (uVar35 != 0) {
          uVar44 = 0;
          iVar110 = 0;
          iVar111 = 1;
          iVar112 = 2;
          iVar113 = 3;
          do {
            uVar45 = (int)lVar41 + (int)uVar44;
            pfVar40 = local_c180 + uVar45;
            *pfVar40 = (float)(~-(uint)(iVar110 < (int)uVar50) & 0x3f800000 |
                              (uint)((float)(int)(iVar110 + x0) *
                                    ((1.0 - auVar61._0_4_ * fVar87) * fVar87 + fVar87)) &
                              -(uint)(iVar110 < (int)uVar50));
            pfVar40[1] = (float)(~-(uint)(iVar111 < (int)uVar50) & 0x3f800000 |
                                (uint)((float)(int)(iVar111 + x0) *
                                      ((1.0 - auVar61._4_4_ * fVar91) * fVar91 + fVar91)) &
                                -(uint)(iVar111 < (int)uVar50));
            pfVar40[2] = (float)(~-(uint)(iVar112 < (int)uVar50) & 0x3f800000 |
                                (uint)((float)(int)(iVar112 + x0) *
                                      ((1.0 - auVar61._8_4_ * fVar92) * fVar92 + fVar92)) &
                                -(uint)(iVar112 < (int)uVar50));
            pfVar40[3] = (float)(~-(uint)(iVar113 < (int)uVar50) & 0x3f800000 |
                                (uint)((float)(int)(iVar113 + x0) *
                                      ((1.0 - auVar61._12_4_ * fVar93) * fVar93 + fVar93)) &
                                -(uint)(iVar113 < (int)uVar50));
            pfVar40 = pfStack_101c0 + uVar45;
            *pfVar40 = (float)(~-(uint)(iVar106 < (int)uVar1) & 0x3f800000 |
                              (uint)((float)(int)(iVar106 + y0) *
                                    ((1.0 - auVar94._0_4_ * fVar53) * fVar53 + fVar53)) &
                              -(uint)(iVar106 < (int)uVar1));
            pfVar40[1] = (float)(~-(uint)(iVar107 < (int)uVar1) & 0x3f800000 |
                                (uint)((float)(int)(iVar107 + y0) *
                                      ((1.0 - auVar94._4_4_ * fVar104) * fVar104 + fVar104)) &
                                -(uint)(iVar107 < (int)uVar1));
            pfVar40[2] = (float)(~-(uint)(iVar108 < (int)uVar1) & 0x3f800000 |
                                (uint)((float)(int)(iVar108 + y0) *
                                      ((1.0 - auVar94._8_4_ * fVar105) * fVar105 + fVar105)) &
                                -(uint)(iVar108 < (int)uVar1));
            pfVar40[3] = (float)(~-(uint)(iVar109 < (int)uVar1) & 0x3f800000 |
                                (uint)((float)(int)(iVar109 + y0) *
                                      ((1.0 - auVar94._12_4_ * fVar52) * fVar52 + fVar52)) &
                                -(uint)(iVar109 < (int)uVar1));
            uVar44 = uVar44 + 4;
            iVar110 = iVar110 + 4;
            iVar111 = iVar111 + 4;
            iVar112 = iVar112 + 4;
            iVar113 = iVar113 + 4;
          } while (uVar44 < uVar35);
        }
        iVar106 = iVar106 + 1;
        iVar107 = iVar107 + 1;
        iVar108 = iVar108 + 1;
        iVar109 = iVar109 + 1;
        lVar41 = lVar41 + (ulong)uVar35;
        bVar56 = iVar38 != iVar46;
        iVar38 = iVar38 + 1;
      } while (bVar56);
    }
    if (uVar27 < (uVar36 & 0xfffffffc)) {
      fVar87 = local_c180[uVar27 - 1];
      fVar91 = pfStack_101c0[uVar27 - 1];
      do {
        local_c180[uVar29] = fVar87;
        pfStack_101c0[uVar29] = fVar91;
        uVar29 = uVar29 + 1;
      } while ((uVar36 & 0xfffffffc) != uVar29);
    }
    if ((patch->flags & 0x10) != 0) {
      fVar87 = patch->level[1];
      uVar45 = x1 + 1;
      fVar91 = patch->level[2];
      iVar38 = (int)(long)patch->level[0];
      iVar106 = (int)(long)fVar91;
      fVar92 = patch->level[3];
      if (iVar38 + 1U < swidth && y0 == 0) {
        if (x0 <= x1) {
          fVar93 = (float)((long)patch->level[0] & 0xffffffff);
          auVar61 = rcpss(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
          fVar93 = (2.0 - fVar93 * auVar61._0_4_) * auVar61._0_4_;
          iVar107 = swidth * 2 + -2;
          uVar27 = x0 + 1;
          if (x0 + 1 < uVar45) {
            uVar27 = uVar45;
          }
          uVar28 = (uVar27 - x0) - 1;
          iVar109 = (x0 * 2 + 1) * iVar38;
          iVar108 = (x0 * 2 + 3) * iVar38;
          lVar41 = 0;
          do {
            if ((bool)(~((int)(uVar28 ^ 0x80000000) < (int)((uint)lVar41 ^ 0x80000000)) & 1)) {
              local_c180[lVar41] = (float)(iVar109 / iVar107) * fVar93;
            }
            if ((int)(((uint)lVar41 | 1) ^ 0x80000000) <= (int)(uVar28 ^ 0x80000000)) {
              local_c180[lVar41 + 1] = (float)(iVar108 / iVar107) * fVar93;
            }
            lVar41 = lVar41 + 2;
            iVar109 = iVar109 + iVar38 * 4;
            iVar108 = iVar108 + iVar38 * 4;
          } while (((uVar27 - x0) + 1 & 0xfffffffe) != (uint)lVar41);
        }
        if (uVar50 == x1) {
          local_c180[uVar34] = 1.0;
        }
      }
      iVar38 = (int)(long)fVar87;
      if (iVar106 + 1U < swidth && y1 + 1 == sheight) {
        uVar44 = (ulong)(iVar46 * uVar35);
        if (x0 <= x1) {
          fVar91 = (float)((long)fVar91 & 0xffffffff);
          auVar61 = rcpss(ZEXT416((uint)fVar91),ZEXT416((uint)fVar91));
          fVar91 = (2.0 - fVar91 * auVar61._0_4_) * auVar61._0_4_;
          iVar107 = swidth * 2 + -2;
          uVar27 = x0 + 1;
          if (x0 + 1 < uVar45) {
            uVar27 = uVar45;
          }
          uVar28 = (uVar27 - x0) - 1;
          iVar109 = (x0 * 2 + 1) * iVar106;
          iVar108 = (x0 * 2 + 3) * iVar106;
          lVar41 = 0;
          do {
            if ((bool)(~((int)(uVar28 ^ 0x80000000) < (int)((uint)lVar41 ^ 0x80000000)) & 1)) {
              local_c180[uVar44 + lVar41] = (float)(iVar109 / iVar107) * fVar91;
            }
            if ((int)(((uint)lVar41 | 1) ^ 0x80000000) <= (int)(uVar28 ^ 0x80000000)) {
              local_c180[uVar44 + lVar41 + 1] = (float)(iVar108 / iVar107) * fVar91;
            }
            lVar41 = lVar41 + 2;
            iVar109 = iVar109 + iVar106 * 4;
            iVar108 = iVar108 + iVar106 * 4;
          } while (((uVar27 - x0) + 1 & 0xfffffffe) != (uint)lVar41);
        }
        if (uVar50 == x1) {
          local_c180[uVar44 + uVar34] = 1.0;
        }
      }
      iVar106 = (int)(long)fVar92;
      if (iVar38 + 1U < sheight && x0 == 0) {
        if (y0 <= y1) {
          fVar87 = (float)((long)fVar87 & 0xffffffff);
          auVar61 = rcpss(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87));
          iVar107 = (y0 * 2 + 1) * iVar38;
          uVar50 = 0;
          uVar27 = y0;
          do {
            pfStack_101c0[(ulong)uVar34 + (ulong)uVar50] =
                 (float)(iVar107 / (int)(sheight * 2 + -2)) *
                 (2.0 - fVar87 * auVar61._0_4_) * auVar61._0_4_;
            uVar27 = uVar27 + 1;
            uVar50 = uVar50 + uVar35;
            iVar107 = iVar107 + iVar38 * 2;
          } while (uVar27 <= y1);
        }
        if (uVar1 == y1) {
          pfStack_101c0[(ulong)uVar34 + (ulong)(iVar46 * uVar35)] = 1.0;
        }
      }
      if (iVar106 + 1U < sheight && uVar45 == swidth) {
        if (y0 <= y1) {
          fVar87 = (float)((long)fVar92 & 0xffffffff);
          auVar61 = rcpss(ZEXT416((uint)fVar87),ZEXT416((uint)fVar87));
          iVar38 = (y0 * 2 + 1) * iVar106;
          uVar44 = 0;
          do {
            pfStack_101c0[uVar44] =
                 (float)(iVar38 / (int)(sheight * 2 + -2)) *
                 (2.0 - fVar87 * auVar61._0_4_) * auVar61._0_4_;
            y0 = y0 + 1;
            uVar44 = (ulong)((int)uVar44 + uVar35);
            iVar38 = iVar38 + iVar106 * 2;
          } while (y0 <= y1);
        }
        if (uVar1 == y1) {
          pfStack_101c0[iVar46 * uVar35] = 1.0;
        }
      }
    }
    auStack_21fc0 = _DAT_01feb9f0;
    auVar61 = auVar64;
    auVar94 = auVar64;
    auVar100 = _DAT_01feb9f0;
    if (3 < uVar36) {
      lVar41 = 0;
      auStack_22010 = _DAT_01feb9f0;
      auVar64 = _DAT_01feba00;
      auVar61 = _DAT_01feba00;
      auVar94 = _DAT_01feba00;
      do {
        local_8100[0]._0_8_ = *(undefined8 *)((long)local_c180 + lVar41);
        local_8100[0]._8_8_ = ((undefined8 *)((long)local_c180 + lVar41))[1];
        local_c140[0]._0_8_ = *(undefined8 *)((long)pfStack_101c0 + lVar41);
        local_c140[0]._8_8_ = ((undefined8 *)((long)pfStack_101c0 + lVar41))[1];
        patchEval<embree::vfloat_impl<4>>
                  (patch,(vfloat_impl<4> *)local_8100,(vfloat_impl<4> *)local_c140);
        if (*(long *)&(geom->super_Geometry).field_0x58 != 0) {
          patchNormal<embree::vfloat_impl<4>>
                    (patch,(vfloat_impl<4> *)local_8100,(vfloat_impl<4> *)local_c140);
          auVar58._0_4_ = fStack_20270 * fStack_20270 + (float)uStack_20260 * (float)uStack_20260;
          auVar58._4_4_ = fStack_2026c * fStack_2026c + uStack_20260._4_4_ * uStack_20260._4_4_;
          auVar58._8_4_ =
               (float)uStack_20268 * (float)uStack_20268 + (float)uStack_20258 * (float)uStack_20258
          ;
          auVar58._12_4_ =
               uStack_20268._4_4_ * uStack_20268._4_4_ + uStack_20258._4_4_ * uStack_20258._4_4_;
          auVar103._0_4_ = (float)uStack_20280 * (float)uStack_20280 + auVar58._0_4_;
          auVar103._4_4_ = uStack_20280._4_4_ * uStack_20280._4_4_ + auVar58._4_4_;
          auVar103._8_4_ = (float)uStack_20278 * (float)uStack_20278 + auVar58._8_4_;
          auVar103._12_4_ = uStack_20278._4_4_ * uStack_20278._4_4_ + auVar58._12_4_;
          uVar45 = -(uint)(auVar103._0_4_ != 0.0);
          uVar27 = -(uint)(auVar103._4_4_ != 0.0);
          uVar34 = -(uint)(auVar103._8_4_ != 0.0);
          uVar35 = -(uint)(auVar103._12_4_ != 0.0);
          auVar58 = rsqrtps(auVar58,auVar103);
          fVar87 = auVar58._0_4_;
          fVar91 = auVar58._4_4_;
          fVar92 = auVar58._8_4_;
          fVar93 = auVar58._12_4_;
          fVar87 = fVar87 * fVar87 * auVar103._0_4_ * -0.5 * fVar87 + fVar87 * 1.5;
          fVar91 = fVar91 * fVar91 * auVar103._4_4_ * -0.5 * fVar91 + fVar91 * 1.5;
          fVar92 = fVar92 * fVar92 * auVar103._8_4_ * -0.5 * fVar92 + fVar92 * 1.5;
          fVar93 = fVar93 * fVar93 * auVar103._12_4_ * -0.5 * fVar93 + fVar93 * 1.5;
          auVar95._0_4_ = ~uVar45 & (uint)(float)uStack_20280;
          auVar95._4_4_ = ~uVar27 & (uint)uStack_20280._4_4_;
          auVar95._8_4_ = ~uVar34 & (uint)(float)uStack_20278;
          auVar95._12_4_ = ~uVar35 & (uint)uStack_20278._4_4_;
          auVar101._0_4_ = ~uVar45 & (uint)fStack_20270;
          auVar101._4_4_ = ~uVar27 & (uint)fStack_2026c;
          auVar101._8_4_ = ~uVar34 & (uint)(float)uStack_20268;
          auVar101._12_4_ = ~uVar35 & (uint)uStack_20268._4_4_;
          auStack_18200._0_4_ = (uint)((float)uStack_20280 * fVar87) & uVar45;
          auStack_18200._4_4_ = (uint)(uStack_20280._4_4_ * fVar91) & uVar27;
          auStack_18200._8_4_ = (uint)((float)uStack_20278 * fVar92) & uVar34;
          auStack_18200._12_4_ = (uint)(uStack_20278._4_4_ * fVar93) & uVar35;
          auStack_18200 = auStack_18200 | auVar95;
          auStack_181f0._0_4_ = (uint)(fStack_20270 * fVar87) & uVar45;
          auStack_181f0._4_4_ = (uint)(fStack_2026c * fVar91) & uVar27;
          auStack_181f0._8_4_ = (uint)((float)uStack_20268 * fVar92) & uVar34;
          auStack_181f0._12_4_ = (uint)(uStack_20268._4_4_ * fVar93) & uVar35;
          auStack_181f0 = auStack_181f0 | auVar101;
          auVar99._0_4_ = (uint)(fVar87 * (float)uStack_20260) & uVar45;
          auVar99._4_4_ = (uint)(fVar91 * uStack_20260._4_4_) & uVar27;
          auVar99._8_4_ = (uint)(fVar92 * (float)uStack_20258) & uVar34;
          auVar99._12_4_ = (uint)(fVar93 * uStack_20258._4_4_) & uVar35;
          aauStack_181e0[0]._0_4_ = ~uVar45 & (uint)(float)uStack_20260;
          aauStack_181e0[0]._4_4_ = ~uVar27 & (uint)uStack_20260._4_4_;
          aauStack_181e0[0]._8_4_ = ~uVar34 & (uint)(float)uStack_20258;
          aauStack_181e0[0]._12_4_ = ~uVar35 & (uint)uStack_20258._4_4_;
          aauStack_181e0[0] = aauStack_181e0[0] | auVar99;
          uStack_20280 = (geom->super_Geometry).userPtr;
          uStack_20278 = geom;
          fStack_20270 = (float)patch->prim;
          fStack_2026c = (float)patch->time_;
          uStack_20258 = auStack_18200;
          puStack_20250 = auStack_181f0;
          pauStack_20248 = aauStack_181e0;
          puStack_20240 = auStack_1c240;
          puStack_20238 = auStack_1c230;
          pauStack_20230 = aauStack_1c220;
          uStack_20228 = 4;
          uStack_20268 = local_8100;
          uStack_20260 = local_c140;
          (**(code **)&(geom->super_Geometry).field_0x58)(&uStack_20280);
        }
        auStack_22010 = minps(auStack_22010,auStack_1c240);
        auVar61 = maxps(auVar61,auStack_1c240);
        auStack_21fc0 = minps(auStack_21fc0,auStack_1c230);
        auVar94 = maxps(auVar94,auStack_1c230);
        auVar100 = minps(auVar100,aauStack_1c220[0]);
        auVar64 = maxps(auVar64,aauStack_1c220[0]);
        lVar41 = lVar41 + 0x10;
      } while ((ulong)(uVar37 + (uVar37 == 0)) << 4 != lVar41);
    }
    auVar57._4_4_ = auStack_22010._0_4_;
    auVar57._0_4_ = auStack_22010._4_4_;
    auVar57._8_4_ = auStack_22010._12_4_;
    auVar57._12_4_ = auStack_22010._8_4_;
    auVar58 = minps(auVar57,auStack_22010);
    auVar11._4_8_ = auStack_22010._8_8_;
    auVar11._0_4_ = auVar58._4_4_;
    auVar66._0_8_ = auVar11._0_8_ << 0x20;
    auVar66._8_4_ = auVar58._8_4_;
    auVar66._12_4_ = auVar58._12_4_;
    auVar67._8_8_ = auVar58._8_8_;
    auVar67._0_8_ = auVar66._8_8_;
    if (auVar58._0_4_ <= auVar58._8_4_) {
      auVar67._0_4_ = auVar58._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[0] = auVar67._0_4_;
    auVar59._4_4_ = auStack_21fc0._0_4_;
    auVar59._0_4_ = auStack_21fc0._4_4_;
    auVar59._8_4_ = auStack_21fc0._12_4_;
    auVar59._12_4_ = auStack_21fc0._8_4_;
    auVar58 = minps(auVar59,auStack_21fc0);
    auVar12._4_8_ = auStack_21fc0._8_8_;
    auVar12._0_4_ = auVar58._4_4_;
    auVar68._0_8_ = auVar12._0_8_ << 0x20;
    auVar68._8_4_ = auVar58._8_4_;
    auVar68._12_4_ = auVar58._12_4_;
    auVar69._8_8_ = auVar58._8_8_;
    auVar69._0_8_ = auVar68._8_8_;
    if (auVar58._0_4_ <= auVar58._8_4_) {
      auVar69._0_4_ = auVar58._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[1] = auVar69._0_4_;
    auVar60._4_4_ = auVar100._0_4_;
    auVar60._0_4_ = auVar100._4_4_;
    auVar60._8_4_ = auVar100._12_4_;
    auVar60._12_4_ = auVar100._8_4_;
    auVar100 = minps(auVar60,auVar100);
    auVar13._4_8_ = auVar69._8_8_;
    auVar13._0_4_ = auVar100._4_4_;
    auVar70._0_8_ = auVar13._0_8_ << 0x20;
    auVar70._8_4_ = auVar100._8_4_;
    auVar70._12_4_ = auVar100._12_4_;
    auVar71._8_8_ = auVar100._8_8_;
    auVar71._0_8_ = auVar70._8_8_;
    if (auVar100._0_4_ <= auVar100._8_4_) {
      auVar71._0_4_ = auVar100._0_4_;
    }
    (__return_storage_ptr__->lower).field_0.m128[2] = auVar71._0_4_;
    auVar100._4_4_ = auVar61._0_4_;
    auVar100._0_4_ = auVar61._4_4_;
    auVar100._8_4_ = auVar61._12_4_;
    auVar100._12_4_ = auVar61._8_4_;
    auVar61 = maxps(auVar100,auVar61);
    auVar14._4_8_ = auVar71._8_8_;
    auVar14._0_4_ = auVar61._4_4_;
    auVar72._0_8_ = auVar14._0_8_ << 0x20;
    auVar72._8_4_ = auVar61._8_4_;
    auVar72._12_4_ = auVar61._12_4_;
    auVar73._8_8_ = auVar61._8_8_;
    auVar73._0_8_ = auVar72._8_8_;
    if (auVar61._8_4_ <= auVar61._0_4_) {
      auVar73._0_4_ = auVar61._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[0] = auVar73._0_4_;
    auVar62._4_4_ = auVar94._0_4_;
    auVar62._0_4_ = auVar94._4_4_;
    auVar62._8_4_ = auVar94._12_4_;
    auVar62._12_4_ = auVar94._8_4_;
    auVar61 = maxps(auVar62,auVar94);
    auVar15._4_8_ = auVar73._8_8_;
    auVar15._0_4_ = auVar61._4_4_;
    auVar74._0_8_ = auVar15._0_8_ << 0x20;
    auVar74._8_4_ = auVar61._8_4_;
    auVar74._12_4_ = auVar61._12_4_;
    auVar75._8_8_ = auVar61._8_8_;
    auVar75._0_8_ = auVar74._8_8_;
    if (auVar61._8_4_ <= auVar61._0_4_) {
      auVar75._0_4_ = auVar61._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[1] = auVar75._0_4_;
    auVar63._4_4_ = auVar64._0_4_;
    auVar63._0_4_ = auVar64._4_4_;
    auVar63._8_4_ = auVar64._12_4_;
    auVar63._12_4_ = auVar64._8_4_;
    auVar64 = maxps(auVar63,auVar64);
    auVar16._4_8_ = auVar75._8_8_;
    auVar16._0_4_ = auVar64._4_4_;
    auVar76._0_8_ = auVar16._0_8_ << 0x20;
    auVar76._8_4_ = auVar64._8_4_;
    auVar76._12_4_ = auVar64._12_4_;
    auVar77._8_8_ = auVar64._8_8_;
    auVar77._0_8_ = auVar76._8_8_;
    if (auVar64._8_4_ <= auVar64._0_4_) {
      auVar77._0_4_ = auVar64._0_4_;
    }
    (__return_storage_ptr__->upper).field_0.m128[2] = auVar77._0_4_;
    goto LAB_00e40838;
  }
  Ny = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 **)&(geom->super_Geometry).field_0x58;
  uStack_1c278 = uVar44;
  uStack_18238 = uVar44;
  uStack_141f8 = uVar44;
  if (uVar50 < 0x1001) {
    pfStack_1c280 = (float *)&uStack_20280;
    pfStack_18240 = (float *)auStack_1c240;
LAB_00e40d47:
    if (uVar50 < 0x1001) {
      pfStack_14200 = (float *)auStack_18200;
    }
    else {
      pfStack_14200 = (float *)alignedMalloc(sVar6,0x40);
    }
  }
  else {
    pfStack_1c280 = (float *)alignedMalloc(sVar6,0x40);
    if (0x1000 < uVar50) {
      pfStack_18240 = (float *)alignedMalloc(sVar6,0x40);
      goto LAB_00e40d47;
    }
    pfStack_18240 = (float *)auStack_1c240;
    pfStack_14200 = (float *)auStack_18200;
  }
  if (Ny == (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
    uVar44 = 0;
  }
  sVar6 = uVar44 * 4;
  local_8138 = uVar44;
  local_40f8 = uVar44;
  local_b8 = uVar44;
  if (uVar44 < 0x1001) {
    local_4100 = local_8100;
    local_8140 = local_c140;
LAB_00e40e12:
    if (uVar44 < 0x1001) {
      local_c0 = local_40c0;
    }
    else {
      local_c0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar6,0x40);
    }
  }
  else {
    local_4100 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar6,0x40);
    if (0x1000 < uVar44) {
      local_8140 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)alignedMalloc(sVar6,0x40);
      goto LAB_00e40e12;
    }
    local_8140 = local_c140;
    local_c0 = local_40c0;
  }
  pRVar7 = (geom->patch_eval_trees).
           super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((geom->patch_eval_trees).
      super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
      ._M_impl.super__Vector_impl_data._M_finish == pRVar7) {
    pfVar40 = *(float **)&patch->patch_v[0][0].field_0;
    uVar34 = patch->time_;
    pBVar8 = (geom->vertices).items;
    lVar41 = 0x1c00;
    puVar42 = auStack_21b9c;
    do {
      *(undefined4 **)(puVar42 + -0x49) = puVar42 + -0xc9;
      *(undefined4 **)(puVar42 + -0x19) = puVar42 + -0x39;
      *(undefined8 *)(puVar42 + -2) = 0;
      *puVar42 = 0;
      puVar42 = puVar42 + 0xe0;
      lVar41 = lVar41 + -0x380;
    } while (lVar41 != 0);
    paStack_20300 = &aStack_21f00;
    pcVar9 = pBVar8[uVar34].super_RawBufferView.ptr_ofs;
    uVar30 = (ulong)(uint)pBVar8[uVar34].super_RawBufferView.stride;
    lVar41 = 0x280;
    pfVar39 = pfVar40;
    uVar44 = 0;
    do {
      if ((7 < uVar44) && (paStack_20300 == &aStack_21f00)) {
        alignedMalloc(0x3840,0x40);
        evalGridBounds();
        lVar32 = 0;
        do {
          GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
                    ((GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                     ((long)paStack_20300 + lVar32),
                     (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                     ((long)&aStack_21f00 + lVar32));
          lVar32 = lVar32 + 0x380;
        } while (lVar32 != 0x1c00);
      }
      paVar26 = paStack_20300;
      uVar2 = uVar44 + 1;
      paVar3 = paStack_20300 + uVar44 * 0x38;
      paVar4 = paStack_20300 + uVar44 * 0x38;
      pfVar43 = paVar4->m128 + 0x10;
      *(undefined1 *)(paVar4->m128 + 0xd6) = 1;
      paVar4->m128[0xd2] = -NAN;
      uVar23 = *(undefined8 *)(pcVar9 + (uint)*pfVar39 * uVar30);
      uVar24 = *(undefined8 *)(pcVar9 + (uint)*pfVar39 * uVar30 + 8);
      *(float *)paVar4 = (float)(int)uVar23;
      *(int *)((long)paVar4 + 4) = (int)((ulong)uVar23 >> 0x20);
      *(undefined8 *)&(paVar4->field_1).z = uVar24;
      paVar4->m128[0xd3] = pfVar39[5];
      paVar4->m128[0xd5] = pfVar39[6];
      paVar4->m128[0xd4] = 0.0;
      pfVar25 = paStack_20300->m128 + uVar44 * 0xe0 + 0x90;
      pfVar31 = paStack_20300->m128 + uVar44 * 0xe0 + 0xa0;
      fVar87 = -NAN;
      fVar91 = -NAN;
      fStack_22034 = -NAN;
      uVar54 = 0;
      pfVar48 = pfVar39;
      fVar92 = 0.0;
      do {
        fVar53 = pfVar48[2];
        fVar104 = pfVar48[1];
        fVar93 = pfVar48[6];
        if (pfVar48[6] <= paVar3->m128[0xd4]) {
          fVar93 = paVar3->m128[0xd4];
        }
        fVar105 = pfVar48[4];
        paVar3->m128[0xd4] = fVar93;
        fVar93 = pfVar48[(long)(int)fVar104 * 8];
        fVar52 = (float)uVar54;
        if ((uint)fVar93 < (uint)fStack_22034) {
          fVar91 = fVar92;
          fVar87 = fVar52;
        }
        pfVar51 = pfVar48 + (long)(int)fVar104 * 8;
        if ((uint)fVar93 < (uint)fStack_22034) {
          fStack_22034 = fVar93;
        }
        if (fVar104 == fVar53) {
          iVar46 = 0;
        }
        else {
          iVar46 = 0;
          do {
            uVar23 = *(undefined8 *)(pcVar9 + (uint)*pfVar51 * uVar30);
            uVar24 = *(undefined8 *)(pcVar9 + (uint)*pfVar51 * uVar30 + 8);
            if ((0x20 < (int)fVar52 + iVar46 + 1U) && (*(float **)pfVar25 == pfVar43)) {
              alignedMalloc(0x800,0x10);
              evalGridBounds();
            }
            puVar5 = (undefined8 *)
                     (*(long *)(paVar3->m128 + 0x90) + (ulong)(uint)((int)fVar52 + iVar46) * 0x10);
            *puVar5 = uVar23;
            puVar5[1] = uVar24;
            iVar46 = iVar46 + 1;
            pfVar51 = pfVar51 + (long)(int)pfVar51[1] * 8;
          } while (pfVar51 != pfVar48 + (long)(int)fVar53 * 8);
          uVar54 = (ulong)(uint)((int)fVar52 + iVar46);
        }
        fVar93 = (float)((int)fVar92 + 1);
        uVar47 = (ulong)(uint)fVar93;
        if ((0x10 < (uint)fVar93) && (*(float **)(paVar3->m128 + 0xc0) == pfVar31)) {
          pvVar33 = operator_new__(0x200);
          *(void **)(paVar3->m128 + 0xc0) = pvVar33;
          lVar32 = 0;
          do {
            *(undefined8 *)(*(long *)(paVar3->m128 + 0xc0) + lVar32 * 8) =
                 *(undefined8 *)((long)paVar26 + lVar32 * 8 + lVar41);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 0x10);
        }
        lVar32 = *(long *)(paVar3->m128 + 0xc0);
        *(int *)(lVar32 + (ulong)(uint)fVar92 * 8) = iVar46;
        *(float *)(lVar32 + (ulong)(uint)fVar92 * 8 + 4) = fVar105;
        *(byte *)(paVar3->m128 + 0xd6) = *(byte *)(paVar3->m128 + 0xd6) & iVar46 == 2;
        if ((long)(int)pfVar51[3] == 0) {
          fVar53 = (float)uVar54;
          if ((uint)*pfVar51 < (uint)fStack_22034) {
            fStack_22034 = *pfVar51;
            fVar87 = fVar53;
            fVar91 = fVar93;
          }
          *(float *)((long)paVar3 + 0x348) = fVar93;
          fVar93 = (float)((int)fVar92 + 2);
          if ((0x10 < (uint)fVar93) && (*(float **)(paVar3->m128 + 0xc0) == pfVar31)) {
            pvVar33 = operator_new__(0x200);
            *(void **)(paVar3->m128 + 0xc0) = pvVar33;
            lVar32 = 0;
            do {
              *(undefined8 *)(*(long *)(paVar3->m128 + 0xc0) + lVar32 * 8) =
                   *(undefined8 *)((long)paVar26 + lVar32 * 8 + lVar41);
              lVar32 = lVar32 + 1;
            } while (lVar32 != 0x10);
          }
          *(undefined8 *)(*(long *)(paVar3->m128 + 0xc0) + uVar47 * 8) = 0x7f80000000000002;
          uVar23 = *(undefined8 *)(pcVar9 + (uint)*pfVar51 * uVar30);
          uVar24 = *(undefined8 *)(pcVar9 + (uint)*pfVar51 * uVar30 + 8);
          if ((0x20 < (int)fVar53 + 1U) && (*(float **)pfVar25 == pfVar43)) {
            alignedMalloc(0x800,0x10);
            evalGridBounds();
          }
          puVar5 = (undefined8 *)(*(long *)pfVar25 + uVar54 * 0x10);
          *puVar5 = uVar23;
          puVar5[1] = uVar24;
          uVar54 = (ulong)((int)fVar53 + 2U);
          if ((0x20 < (int)fVar53 + 2U) && (*(float **)pfVar25 == pfVar43)) {
            alignedMalloc(0x800,0x10);
            evalGridBounds();
          }
          uVar23 = *(undefined8 *)&(paVar3->field_1).z;
          puVar5 = (undefined8 *)(*(long *)(paVar3->m128 + 0x90) + (ulong)((int)fVar53 + 1U) * 0x10)
          ;
          *puVar5 = *(undefined8 *)&(paVar3->field_1).x;
          puVar5[1] = uVar23;
          fVar92 = pfVar39[3];
          pfVar48 = pfVar39;
          while (fVar92 != 0.0) {
            lVar32 = (long)(int)fVar92;
            fVar92 = pfVar48[lVar32 * 8 + (long)(int)pfVar48[lVar32 * 8 + 1] * 8 + 3];
            pfVar48 = pfVar48 + lVar32 * 8 + (long)(int)pfVar48[lVar32 * 8 + 1] * 8;
          }
        }
        else {
          pfVar48 = pfVar51 + (long)(int)pfVar51[3] * 8;
        }
        fVar92 = fVar93;
      } while (pfVar48 != pfVar39);
      paVar3->m128[0xd1] = (float)uVar54;
      *(float *)(paVar3 + 0x34) = fVar93;
      paVar3->m128[0xd9] = fStack_22034;
      paVar3->m128[0xd7] = fVar91;
      paVar3->m128[0xd8] = fVar87;
      if (0xe < uVar44) break;
      pfVar39 = pfVar39 + (long)(int)pfVar39[1] * 8;
      lVar41 = lVar41 + 0x380;
      uVar44 = uVar2;
    } while (pfVar39 != pfVar40);
    uStack_202c0 = (undefined4)uVar2;
    pfVar40 = (float *)0x0;
    if ((patch->flags & 0x10) != 0) {
      pfVar40 = patch->level;
    }
    paVar49 = Ny;
    paVar55 = Ny;
    if (Ny != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
      Ny = local_8140;
      paVar49 = local_c0;
      paVar55 = local_4100;
    }
    feature_adaptive_eval_grid<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
              ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&aStack_21f00.field_1,
               (uint)patch->patch_v[0][0].field_0.m128[2],pfVar40,x0,x1,y0,y1,swidth,sheight,
               pfStack_1c280,pfStack_18240,pfStack_14200,local_c180,pfStack_101c0,paVar55->v,Ny->v,
               paVar49->v,uVar35,uVar45);
    GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::~GeneralCatmullClarkPatchT
              ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&aStack_21f00.field_1);
  }
  else {
    pfVar40 = (float *)0x0;
    if ((patch->flags & 0x10) != 0) {
      pfVar40 = patch->level;
    }
    paVar49 = Ny;
    paVar55 = Ny;
    if (Ny != (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)0x0) {
      Ny = local_c0;
      paVar49 = local_4100;
      paVar55 = local_8140;
    }
    feature_adaptive_eval_grid<embree::sse2::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
              (pRVar7 + (ulong)(patch->prim * (geom->super_Geometry).numTimeSteps + patch->time_) *
                        8,(uint)patch->patch_v[0][0].field_0.m128[2],pfVar40,x0,x1,y0,y1,swidth,
               sheight,pfStack_1c280,pfStack_18240,pfStack_14200,local_c180,pfStack_101c0,paVar49->v
               ,paVar55->v,Ny->v,uVar35,uVar45);
  }
  pcVar10 = *(code **)&(geom->super_Geometry).field_0x58;
  if (pcVar10 != (code *)0x0) {
    aStack_21f00._0_8_ = (geom->super_Geometry).userPtr;
    aStack_21f00._8_8_ = geom;
    uStack_21ef0 = patch->prim;
    uStack_21eec = patch->time_;
    pfStack_21ee8 = local_c180;
    pfStack_21ee0 = pfStack_101c0;
    paStack_21ed8 = local_4100;
    paStack_21ed0 = local_8140;
    paStack_21ec8 = local_c0;
    pfStack_21ec0 = pfStack_1c280;
    pfStack_21eb8 = pfStack_18240;
    pfStack_21eb0 = pfStack_14200;
    uStack_21ea8 = uVar27;
    (*pcVar10)();
  }
  if (uVar27 < (uVar36 & 0xfffffffc)) {
    uVar27 = uVar27 - 1;
    fVar87 = local_c180[uVar27];
    fVar91 = pfStack_101c0[uVar27];
    fVar92 = pfStack_1c280[uVar27];
    fVar93 = pfStack_18240[uVar27];
    fVar53 = pfStack_14200[uVar27];
    do {
      local_c180[uVar29] = fVar87;
      pfStack_101c0[uVar29] = fVar91;
      pfStack_1c280[uVar29] = fVar92;
      pfStack_18240[uVar29] = fVar93;
      pfStack_14200[uVar29] = fVar53;
      uVar29 = uVar29 + 1;
    } while ((uVar36 & 0xfffffffc) != uVar29);
  }
  auVar64 = _DAT_01feba00;
  auVar61 = _DAT_01feba00;
  auVar94 = _DAT_01feba00;
  auVar100 = _DAT_01feb9f0;
  auVar58 = _DAT_01feb9f0;
  auVar99 = _DAT_01feb9f0;
  if (3 < uVar36) {
    lVar41 = 0;
    do {
      auVar99 = minps(auVar99,*(undefined1 (*) [16])((long)pfStack_1c280 + lVar41));
      auVar58 = minps(auVar58,*(undefined1 (*) [16])((long)pfStack_18240 + lVar41));
      auVar100 = minps(auVar100,*(undefined1 (*) [16])((long)pfStack_14200 + lVar41));
      auVar94 = maxps(auVar94,*(undefined1 (*) [16])((long)pfStack_1c280 + lVar41));
      auVar61 = maxps(auVar61,*(undefined1 (*) [16])((long)pfStack_18240 + lVar41));
      auVar64 = maxps(auVar64,*(undefined1 (*) [16])((long)pfStack_14200 + lVar41));
      lVar41 = lVar41 + 0x10;
    } while ((ulong)(uVar37 + (uVar37 == 0)) << 4 != lVar41);
  }
  auVar102._4_4_ = auVar99._0_4_;
  auVar102._0_4_ = auVar99._4_4_;
  auVar102._8_4_ = auVar99._12_4_;
  auVar102._12_4_ = auVar99._8_4_;
  auVar103 = minps(auVar102,auVar99);
  auVar17._4_8_ = auVar99._8_8_;
  auVar17._0_4_ = auVar103._4_4_;
  auVar96._0_8_ = auVar17._0_8_ << 0x20;
  auVar96._8_4_ = auVar103._8_4_;
  auVar96._12_4_ = auVar103._12_4_;
  auVar97._8_8_ = auVar103._8_8_;
  auVar97._0_8_ = auVar96._8_8_;
  if (auVar103._0_4_ <= auVar103._8_4_) {
    auVar97._0_4_ = auVar103._0_4_;
  }
  (__return_storage_ptr__->lower).field_0.m128[0] = auVar97._0_4_;
  auVar98._4_4_ = auVar58._0_4_;
  auVar98._0_4_ = auVar58._4_4_;
  auVar98._8_4_ = auVar58._12_4_;
  auVar98._12_4_ = auVar58._8_4_;
  auVar99 = minps(auVar98,auVar58);
  auVar18._4_8_ = auVar58._8_8_;
  auVar18._0_4_ = auVar99._4_4_;
  auVar88._0_8_ = auVar18._0_8_ << 0x20;
  auVar88._8_4_ = auVar99._8_4_;
  auVar88._12_4_ = auVar99._12_4_;
  auVar89._8_8_ = auVar99._8_8_;
  auVar89._0_8_ = auVar88._8_8_;
  if (auVar99._0_4_ <= auVar99._8_4_) {
    auVar89._0_4_ = auVar99._0_4_;
  }
  (__return_storage_ptr__->lower).field_0.m128[1] = auVar89._0_4_;
  auVar90._4_4_ = auVar100._0_4_;
  auVar90._0_4_ = auVar100._4_4_;
  auVar90._8_4_ = auVar100._12_4_;
  auVar90._12_4_ = auVar100._8_4_;
  auVar58 = minps(auVar90,auVar100);
  auVar19._4_8_ = auVar100._8_8_;
  auVar19._0_4_ = auVar58._4_4_;
  auVar84._0_8_ = auVar19._0_8_ << 0x20;
  auVar84._8_4_ = auVar58._8_4_;
  auVar84._12_4_ = auVar58._12_4_;
  auVar85._8_8_ = auVar58._8_8_;
  auVar85._0_8_ = auVar84._8_8_;
  if (auVar58._0_4_ <= auVar58._8_4_) {
    auVar85._0_4_ = auVar58._0_4_;
  }
  (__return_storage_ptr__->lower).field_0.m128[2] = auVar85._0_4_;
  auVar86._4_4_ = auVar94._0_4_;
  auVar86._0_4_ = auVar94._4_4_;
  auVar86._8_4_ = auVar94._12_4_;
  auVar86._12_4_ = auVar94._8_4_;
  auVar100 = maxps(auVar86,auVar94);
  auVar20._4_8_ = auVar94._8_8_;
  auVar20._0_4_ = auVar100._4_4_;
  auVar81._0_8_ = auVar20._0_8_ << 0x20;
  auVar81._8_4_ = auVar100._8_4_;
  auVar81._12_4_ = auVar100._12_4_;
  auVar82._8_8_ = auVar100._8_8_;
  auVar82._0_8_ = auVar81._8_8_;
  if (auVar100._8_4_ <= auVar100._0_4_) {
    auVar82._0_4_ = auVar100._0_4_;
  }
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar82._0_4_;
  auVar83._4_4_ = auVar61._0_4_;
  auVar83._0_4_ = auVar61._4_4_;
  auVar83._8_4_ = auVar61._12_4_;
  auVar83._12_4_ = auVar61._8_4_;
  auVar94 = maxps(auVar83,auVar61);
  auVar21._4_8_ = auVar61._8_8_;
  auVar21._0_4_ = auVar94._4_4_;
  auVar78._0_8_ = auVar21._0_8_ << 0x20;
  auVar78._8_4_ = auVar94._8_4_;
  auVar78._12_4_ = auVar94._12_4_;
  auVar79._8_8_ = auVar94._8_8_;
  auVar79._0_8_ = auVar78._8_8_;
  if (auVar94._8_4_ <= auVar94._0_4_) {
    auVar79._0_4_ = auVar94._0_4_;
  }
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar79._0_4_;
  auVar80._4_4_ = auVar64._0_4_;
  auVar80._0_4_ = auVar64._4_4_;
  auVar80._8_4_ = auVar64._12_4_;
  auVar80._12_4_ = auVar64._8_4_;
  auVar61 = maxps(auVar80,auVar64);
  auVar22._4_8_ = auVar64._8_8_;
  auVar22._0_4_ = auVar61._4_4_;
  auVar64._0_8_ = auVar22._0_8_ << 0x20;
  auVar64._8_4_ = auVar61._8_4_;
  auVar64._12_4_ = auVar61._12_4_;
  auVar65._8_8_ = auVar61._8_8_;
  auVar65._0_8_ = auVar64._8_8_;
  if (auVar61._8_4_ <= auVar61._0_4_) {
    auVar65._0_4_ = auVar61._0_4_;
  }
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar65._0_4_;
  if (local_c0 != local_40c0) {
    alignedFree(local_c0);
  }
  if (local_8140 != local_c140) {
    alignedFree(local_8140);
  }
  if (local_4100 != local_8100) {
    alignedFree(local_4100);
  }
  if (pfStack_14200 != (float *)auStack_18200) {
    alignedFree(pfStack_14200);
  }
  if (pfStack_18240 != (float *)auStack_1c240) {
    alignedFree(pfStack_18240);
  }
  if (pfStack_1c280 != (float *)&uStack_20280) {
    alignedFree(pfStack_1c280);
  }
LAB_00e40838:
  if (pfStack_101c0 != afStack_141c0) {
    alignedFree(pfStack_101c0);
  }
  if (local_c180 != afStack_10180) {
    alignedFree(local_c180);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa evalGridBounds(const SubdivPatch1Base& patch,
                           const unsigned x0, const unsigned x1,
                           const unsigned y0, const unsigned y1,
                           const unsigned swidth, const unsigned sheight,
                           const SubdivMesh* const geom)
    {
      BBox3fa b(empty);
      const unsigned dwidth  = x1-x0+1;
      const unsigned dheight = y1-y0+1;
      const unsigned M = dwidth*dheight+VSIZEX;
      const unsigned grid_size_simd_blocks = (M-1)/VSIZEX;
      dynamic_large_stack_array(float,grid_u,M,64*64*sizeof(float));
      dynamic_large_stack_array(float,grid_v,M,64*64*sizeof(float));

      if (unlikely(patch.type == SubdivPatch1Base::EVAL_PATCH))
      {
        const bool displ = geom->displFunc;
        dynamic_large_stack_array(float,grid_x,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_y,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_z,M,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_x,displ ? M : 0,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_y,displ ? M : 0,64*64*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_z,displ ? M : 0,64*64*sizeof(float));

        if (geom->patch_eval_trees.size())
        {
          feature_adaptive_eval_grid<PatchEvalGrid> 
            (geom->patch_eval_trees[geom->numTimeSteps*patch.primID()+patch.time()], patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
             x0,x1,y0,y1,swidth,sheight,
             grid_x,grid_y,grid_z,grid_u,grid_v,
             displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
             dwidth,dheight);
        } 
        else 
        {
          GeneralCatmullClarkPatch3fa ccpatch(patch.edge(),geom->getVertexBuffer(patch.time()));
          
          feature_adaptive_eval_grid <FeatureAdaptiveEvalGrid,GeneralCatmullClarkPatch3fa>
            (ccpatch, patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
            x0,x1,y0,y1,swidth,sheight,
            grid_x,grid_y,grid_z,grid_u,grid_v,
            displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
            dwidth,dheight);
        }

        /* call displacement shader */
        if (unlikely(geom->displFunc))
        {
          RTCDisplacementFunctionNArguments args;
          args.geometryUserPtr = geom->userPtr;
          args.geometry = (RTCGeometry)geom;
          //args.geomID = patch.geomID();
          args.primID = patch.primID();
          args.timeStep = patch.time();
          args.u = grid_u;
          args.v = grid_v;
          args.Ng_x = grid_Ng_x;
          args.Ng_y = grid_Ng_y;
          args.Ng_z = grid_Ng_z;
          args.P_x = grid_x;
          args.P_y = grid_y;
          args.P_z = grid_z;
          args.N = dwidth*dheight;
          geom->displFunc(&args);
        }

        /* set last elements in u,v array to 1.0f */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        const float last_x = grid_x[dwidth*dheight-1];
        const float last_y = grid_y[dwidth*dheight-1];
        const float last_z = grid_z[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++)
        {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
          grid_x[i] = last_x;
          grid_y[i] = last_y;
          grid_z[i] = last_z;
        }

        vfloatx bounds_min_x = pos_inf;
        vfloatx bounds_min_y = pos_inf;
        vfloatx bounds_min_z = pos_inf;
        vfloatx bounds_max_x = neg_inf;
        vfloatx bounds_max_y = neg_inf;
        vfloatx bounds_max_z = neg_inf;
        for (unsigned i = 0; i<grid_size_simd_blocks; i++)
        {
          vfloatx x = vfloatx::loadu(&grid_x[i * VSIZEX]);
          vfloatx y = vfloatx::loadu(&grid_y[i * VSIZEX]);
          vfloatx z = vfloatx::loadu(&grid_z[i * VSIZEX]);

	  bounds_min_x = min(bounds_min_x,x);
	  bounds_min_y = min(bounds_min_y,y);
	  bounds_min_z = min(bounds_min_z,z);

	  bounds_max_x = max(bounds_max_x,x);
	  bounds_max_y = max(bounds_max_y,y);
	  bounds_max_z = max(bounds_max_z,z);
        }

        b.lower.x = reduce_min(bounds_min_x);  
        b.lower.y = reduce_min(bounds_min_y);
        b.lower.z = reduce_min(bounds_min_z);
        b.upper.x = reduce_max(bounds_max_x);
        b.upper.y = reduce_max(bounds_max_y);
        b.upper.z = reduce_max(bounds_max_z);
        //b.lower.a = 0;
        //b.upper.a = 0;
      }
      else
      {
        /* grid_u, grid_v need to be padded as we write with SIMD granularity */
        gridUVTessellator(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* set last elements in u,v array to last valid point */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++) {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
        }

        /* stitch edges if necessary */
        if (unlikely(patch.needsStitching()))
          stitchUVGrid(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* iterates over all grid points */
        Vec3vfx bounds_min;
        bounds_min[0] = pos_inf;
        bounds_min[1] = pos_inf;
        bounds_min[2] = pos_inf;

        Vec3vfx bounds_max;
        bounds_max[0] = neg_inf;
        bounds_max[1] = neg_inf;
        bounds_max[2] = neg_inf;

        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          Vec3vfx vtx = patchEval(patch,u,v);
        
          /* evaluate displacement function */
          if (unlikely(geom->displFunc != nullptr))
          {
            const Vec3vfx normal = normalize_safe(patchNormal(patch,u,v));
            RTCDisplacementFunctionNArguments args;
            args.geometryUserPtr = geom->userPtr;
            args.geometry = (RTCGeometry)geom;
            //args.geomID = patch.geomID();
            args.primID = patch.primID();
            args.timeStep = patch.time();
            args.u = &u[0];
            args.v = &v[0];
            args.Ng_x = &normal.x[0];
            args.Ng_y = &normal.y[0];
            args.Ng_z = &normal.z[0];
            args.P_x = &vtx.x[0];
            args.P_y = &vtx.y[0];
            args.P_z = &vtx.z[0];
            args.N = VSIZEX;
            geom->displFunc(&args);
          }

          bounds_min[0] = min(bounds_min[0],vtx.x);
          bounds_max[0] = max(bounds_max[0],vtx.x);
          bounds_min[1] = min(bounds_min[1],vtx.y);
          bounds_max[1] = max(bounds_max[1],vtx.y);
          bounds_min[2] = min(bounds_min[2],vtx.z);
          bounds_max[2] = max(bounds_max[2],vtx.z);      
        }

        b.lower.x = reduce_min(bounds_min[0]);
        b.lower.y = reduce_min(bounds_min[1]);
        b.lower.z = reduce_min(bounds_min[2]);
        b.upper.x = reduce_max(bounds_max[0]);
        b.upper.y = reduce_max(bounds_max[1]);
        b.upper.z = reduce_max(bounds_max[2]);
        //b.lower.a = 0;
        //b.upper.a = 0;
      }

      assert( std::isfinite(b.lower.x) );
      assert( std::isfinite(b.lower.y) );
      assert( std::isfinite(b.lower.z) );

      assert( std::isfinite(b.upper.x) );
      assert( std::isfinite(b.upper.y) );
      assert( std::isfinite(b.upper.z) );


      assert(b.lower.x <= b.upper.x);
      assert(b.lower.y <= b.upper.y);
      assert(b.lower.z <= b.upper.z);
      return b;
    }